

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_block_header(archive_read *a,uint8_t *p,ssize_t *block_size,
                          compressed_block_header *hdr)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint8_t calculated_cksum;
  compressed_block_header *hdr_local;
  ssize_t *block_size_local;
  uint8_t *p_local;
  archive_read *a_local;
  
  uVar2 = p[1];
  hdr->block_flags_u8 = p[0];
  hdr->block_cksum = uVar2;
  bVar1 = bf_byte_count(hdr);
  if (bVar1 < 3) {
    *block_size = 0;
    uVar2 = bf_byte_count(hdr);
    if (uVar2 == '\0') {
      *block_size = (ulong)p[2];
    }
    else if (uVar2 == '\x01') {
      uVar3 = archive_le16dec(p + 2);
      *block_size = (ulong)uVar3;
    }
    else {
      if (uVar2 != '\x02') {
        return L'\xffffffe2';
      }
      uVar4 = archive_le32dec(p + 2);
      *block_size = (ulong)uVar4;
      *block_size = *block_size & 0xffffff;
    }
    bVar1 = hdr->block_flags_u8 ^ 0x5a ^ (byte)*block_size ^ (byte)((ulong)*block_size >> 8) ^
            (byte)((ulong)*block_size >> 0x10);
    if (bVar1 == hdr->block_cksum) {
      a_local._4_4_ = L'\0';
    }
    else {
      archive_set_error(&a->archive,0x54,"Block checksum error: got 0x%x, expected 0x%x",
                        (ulong)hdr->block_cksum,(ulong)bVar1);
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  else {
    bVar1 = bf_byte_count(hdr);
    archive_set_error(&a->archive,0x54,"Unsupported block header size (was %d, max is 2)",
                      (ulong)bVar1);
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int parse_block_header(struct archive_read* a, const uint8_t* p,
    ssize_t* block_size, struct compressed_block_header* hdr)
{
	uint8_t calculated_cksum;
	memcpy(hdr, p, sizeof(struct compressed_block_header));

	if(bf_byte_count(hdr) > 2) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported block header size (was %d, max is 2)",
		    bf_byte_count(hdr));
		return ARCHIVE_FATAL;
	}

	/* This should probably use bit reader interface in order to be more
	 * future-proof. */
	*block_size = 0;
	switch(bf_byte_count(hdr)) {
		/* 1-byte block size */
		case 0:
			*block_size = *(const uint8_t*) &p[2];
			break;

		/* 2-byte block size */
		case 1:
			*block_size = archive_le16dec(&p[2]);
			break;

		/* 3-byte block size */
		case 2:
			*block_size = archive_le32dec(&p[2]);
			*block_size &= 0x00FFFFFF;
			break;

		/* Other block sizes are not supported. This case is not
		 * reached, because we have an 'if' guard before the switch
		 * that makes sure of it. */
		default:
			return ARCHIVE_FATAL;
	}

	/* Verify the block header checksum. 0x5A is a magic value and is
	 * always * constant. */
	calculated_cksum = 0x5A
	    ^ (uint8_t) hdr->block_flags_u8
	    ^ (uint8_t) *block_size
	    ^ (uint8_t) (*block_size >> 8)
	    ^ (uint8_t) (*block_size >> 16);

	if(calculated_cksum != hdr->block_cksum) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Block checksum error: got 0x%x, expected 0x%x",
		    hdr->block_cksum, calculated_cksum);

		return ARCHIVE_FATAL;
#endif
	}

	return ARCHIVE_OK;
}